

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-fork.c
# Opt level: O3

void assert_run_work(uv_loop_t *loop)

{
  uint uVar1;
  int iVar2;
  uv_work_t work_req;
  undefined1 auStack_88 [128];
  
  if (work_cb_count == 0) {
    if (after_work_cb_count != 0) goto LAB_0014fd32;
    uVar1 = getpid();
    printf("Queue in %d\n",(ulong)uVar1);
    iVar2 = uv_queue_work(loop,auStack_88,work_cb,after_work_cb);
    if (iVar2 != 0) goto LAB_0014fd37;
    uVar1 = getpid();
    printf("Running in %d\n",(ulong)uVar1);
    uv_run(loop,0);
    if (work_cb_count == 1) {
      if (after_work_cb_count == 1) {
        work_cb_count = 0;
        after_work_cb_count = 0;
        return;
      }
      goto LAB_0014fd41;
    }
  }
  else {
    assert_run_work_cold_1();
LAB_0014fd32:
    assert_run_work_cold_2();
LAB_0014fd37:
    assert_run_work_cold_3();
  }
  assert_run_work_cold_4();
LAB_0014fd41:
  assert_run_work_cold_5();
  timer_cb_called = timer_cb_called + 1;
  uv_close();
  return;
}

Assistant:

static void assert_run_work(uv_loop_t* const loop) {
  uv_work_t work_req;
  int r;

  ASSERT(work_cb_count == 0);
  ASSERT(after_work_cb_count == 0);
  printf("Queue in %d\n", getpid());
  r = uv_queue_work(loop, &work_req, work_cb, after_work_cb);
  ASSERT(r == 0);
  printf("Running in %d\n", getpid());
  uv_run(loop, UV_RUN_DEFAULT);

  ASSERT(work_cb_count == 1);
  ASSERT(after_work_cb_count == 1);

  /* cleanup  */
  work_cb_count = 0;
  after_work_cb_count = 0;
}